

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerMSL::mark_scalar_layout_structs(CompilerMSL *this,SPIRType *type)

{
  ulong uVar1;
  bool bVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint uVar5;
  uint32_t value;
  SPIRType *type_00;
  SPIRType *struct_type;
  CompilerError *pCVar6;
  uint uVar7;
  uint32_t dim;
  ulong uVar8;
  size_t sVar9;
  allocator local_7d;
  uint32_t local_7c;
  ulong local_78;
  uint local_70;
  uint local_6c;
  SPIRType *local_68;
  ulong local_60;
  size_t local_58;
  string local_50;
  
  uVar8 = (ulong)(uint)(type->member_types).
                       super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size;
  local_78 = 0;
  local_68 = type;
  local_60 = uVar8;
  do {
    if (local_78 == uVar8) {
      return;
    }
    type_00 = Compiler::get<spirv_cross::SPIRType>
                        ((Compiler *)this,
                         (type->member_types).
                         super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr
                         [local_78].id);
    if ((*(int *)&(type_00->super_IVariant).field_0xc == 0xf) &&
       ((struct_type = type_00, type_00->pointer != true ||
        (type_00->storage != StorageClassPhysicalStorageBuffer)))) {
      while ((struct_type->array).super_VectorView<unsigned_int>.buffer_size != 0) {
        struct_type = Compiler::get<spirv_cross::SPIRType>
                                ((Compiler *)this,(struct_type->parent_type).id);
      }
      bVar2 = Compiler::has_extended_decoration
                        ((Compiler *)this,(struct_type->super_IVariant).self.id,
                         SPIRVCrossDecorationPhysicalTypePacked);
      uVar1 = local_78;
      if (!bVar2) {
        uVar4 = (uint32_t)local_78;
        local_7c = get_declared_struct_member_alignment_msl(this,type,uVar4);
        uVar3 = get_declared_struct_member_size_msl(this,type,uVar4);
        uVar4 = Compiler::type_struct_member_offset((Compiler *)this,type,uVar4);
        if (uVar1 + 1 < local_60) {
          uVar5 = Compiler::type_struct_member_offset((Compiler *)this,type,(uint32_t)(uVar1 + 1));
        }
        else {
          uVar5 = uVar3 + uVar4;
        }
        value = 0;
        uVar7 = uVar4 % local_7c;
        bVar2 = uVar5 < uVar3 + uVar4;
        sVar9 = (type_00->array).super_VectorView<unsigned_int>.buffer_size;
        if (sVar9 != 0) {
          local_7c = uVar3 + uVar4;
          local_70 = uVar5;
          local_6c = uVar7;
          local_58 = sVar9;
          value = Compiler::type_struct_member_array_stride
                            ((Compiler *)this,local_68,(uint32_t)local_78);
          sVar9 = (type_00->array).super_VectorView<unsigned_int>.buffer_size;
          for (uVar3 = 0; (int)sVar9 - 1U != uVar3; uVar3 = uVar3 + 1) {
            uVar4 = CompilerGLSL::to_array_size_literal(&this->super_CompilerGLSL,type_00,uVar3);
            value = value / (uVar4 + (uVar4 == 0));
          }
          bVar2 = local_70 < local_7c;
          uVar3 = get_declared_struct_size_msl(this,struct_type,false,false);
          bVar2 = value < uVar3 || bVar2;
          sVar9 = local_58;
          uVar7 = local_6c;
        }
        if ((uVar7 != 0) || (bVar2)) {
          mark_struct_members_packed(this,struct_type);
        }
        mark_scalar_layout_structs(this,struct_type);
        uVar8 = local_60;
        type = local_68;
        if (sVar9 != 0) {
          uVar3 = get_declared_struct_size_msl(this,struct_type,true,true);
          if (value < uVar3) {
            pCVar6 = (CompilerError *)__cxa_allocate_exception(0x10);
            ::std::__cxx11::string::string
                      ((string *)&local_50,
                       "Cannot express an array stride smaller than size of struct type.",&local_7d)
            ;
            CompilerError::CompilerError(pCVar6,&local_50);
            __cxa_throw(pCVar6,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
          }
          bVar2 = Compiler::has_extended_decoration
                            ((Compiler *)this,(struct_type->super_IVariant).self.id,
                             SPIRVCrossDecorationPaddingTarget);
          uVar3 = (struct_type->super_IVariant).self.id;
          if (bVar2) {
            uVar3 = Compiler::get_extended_decoration
                              ((Compiler *)this,uVar3,SPIRVCrossDecorationPaddingTarget);
            if (value != uVar3) {
              pCVar6 = (CompilerError *)__cxa_allocate_exception(0x10);
              ::std::__cxx11::string::string
                        ((string *)&local_50,
                         "A struct is used with different array strides. Cannot express this in MSL."
                         ,&local_7d);
              CompilerError::CompilerError(pCVar6,&local_50);
              __cxa_throw(pCVar6,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
            }
          }
          else {
            Compiler::set_extended_decoration
                      ((Compiler *)this,uVar3,SPIRVCrossDecorationPaddingTarget,value);
          }
        }
      }
    }
    local_78 = local_78 + 1;
  } while( true );
}

Assistant:

void CompilerMSL::mark_scalar_layout_structs(const SPIRType &type)
{
	uint32_t mbr_cnt = uint32_t(type.member_types.size());
	for (uint32_t i = 0; i < mbr_cnt; i++)
	{
		// Handle possible recursion when a struct contains a pointer to its own type nested somewhere.
		auto &mbr_type = get<SPIRType>(type.member_types[i]);
		if (mbr_type.basetype == SPIRType::Struct && !(mbr_type.pointer && mbr_type.storage == StorageClassPhysicalStorageBuffer))
		{
			auto *struct_type = &mbr_type;
			while (!struct_type->array.empty())
				struct_type = &get<SPIRType>(struct_type->parent_type);

			if (has_extended_decoration(struct_type->self, SPIRVCrossDecorationPhysicalTypePacked))
				continue;

			uint32_t msl_alignment = get_declared_struct_member_alignment_msl(type, i);
			uint32_t msl_size = get_declared_struct_member_size_msl(type, i);
			uint32_t spirv_offset = type_struct_member_offset(type, i);
			uint32_t spirv_offset_next;
			if (i + 1 < mbr_cnt)
				spirv_offset_next = type_struct_member_offset(type, i + 1);
			else
				spirv_offset_next = spirv_offset + msl_size;

			// Both are complicated cases. In scalar layout, a struct of float3 might just consume 12 bytes,
			// and the next member will be placed at offset 12.
			bool struct_is_misaligned = (spirv_offset % msl_alignment) != 0;
			bool struct_is_too_large = spirv_offset + msl_size > spirv_offset_next;
			uint32_t array_stride = 0;
			bool struct_needs_explicit_padding = false;

			// Verify that if a struct is used as an array that ArrayStride matches the effective size of the struct.
			if (!mbr_type.array.empty())
			{
				array_stride = type_struct_member_array_stride(type, i);
				uint32_t dimensions = uint32_t(mbr_type.array.size() - 1);
				for (uint32_t dim = 0; dim < dimensions; dim++)
				{
					uint32_t array_size = to_array_size_literal(mbr_type, dim);
					array_stride /= max(array_size, 1u);
				}

				// Set expected struct size based on ArrayStride.
				struct_needs_explicit_padding = true;

				// If struct size is larger than array stride, we might be able to fit, if we tightly pack.
				if (get_declared_struct_size_msl(*struct_type) > array_stride)
					struct_is_too_large = true;
			}

			if (struct_is_misaligned || struct_is_too_large)
				mark_struct_members_packed(*struct_type);
			mark_scalar_layout_structs(*struct_type);

			if (struct_needs_explicit_padding)
			{
				msl_size = get_declared_struct_size_msl(*struct_type, true, true);
				if (array_stride < msl_size)
				{
					SPIRV_CROSS_THROW("Cannot express an array stride smaller than size of struct type.");
				}
				else
				{
					if (has_extended_decoration(struct_type->self, SPIRVCrossDecorationPaddingTarget))
					{
						if (array_stride !=
						    get_extended_decoration(struct_type->self, SPIRVCrossDecorationPaddingTarget))
							SPIRV_CROSS_THROW(
							    "A struct is used with different array strides. Cannot express this in MSL.");
					}
					else
						set_extended_decoration(struct_type->self, SPIRVCrossDecorationPaddingTarget, array_stride);
				}
			}
		}
	}
}